

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall
WarningBitsConditionChecker::Condition
          (WarningBitsConditionChecker *this,CBlockIndex *pindex,Params *params)

{
  long lVar1;
  uint uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((pindex->nHeight < params->MinBIP9WarningHeight) ||
      ((pindex->nVersion & 0xe0000000U) != 0x20000000)) ||
     (((uint)pindex->nVersion >> (this->m_bit & 0x1fU) & 1) == 0)) {
    bVar3 = false;
  }
  else {
    uVar2 = VersionBitsCache::ComputeBlockVersion
                      (&this->m_chainman->m_versionbitscache,pindex->pprev,params);
    bVar3 = (uVar2 >> (this->m_bit & 0x1fU) & 1) == 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool Condition(const CBlockIndex* pindex, const Consensus::Params& params) const override
    {
        return pindex->nHeight >= params.MinBIP9WarningHeight &&
               ((pindex->nVersion & VERSIONBITS_TOP_MASK) == VERSIONBITS_TOP_BITS) &&
               ((pindex->nVersion >> m_bit) & 1) != 0 &&
               ((m_chainman.m_versionbitscache.ComputeBlockVersion(pindex->pprev, params) >> m_bit) & 1) == 0;
    }